

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  FILE *__s1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  char *__format;
  FILE *this_00;
  uint uVar8;
  char **ppcVar9;
  int iVar10;
  allocator<char> local_d1;
  char **local_d0;
  CommandOptions *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  ui32_t *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this->error_flag = true;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  *(undefined4 *)((long)&this->fb_dump_size + 3) = 0;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  ppcVar9 = &this->input_filename;
  local_c0 = &(this->prefix_buffer).field_2;
  (this->edit_rate).Numerator = 0;
  (this->edit_rate).Denominator = 0;
  this->file_prefix = (char *)0x0;
  this->input_filename = (char *)0x0;
  this->extension = (char *)0x0;
  this->g_stream_sid = 0;
  (this->prefix_buffer)._M_dataplus._M_p = (pointer)local_c0;
  (this->prefix_buffer)._M_string_length = 0;
  (this->prefix_buffer).field_2._M_local_buf[0] = '\0';
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  bVar2 = 1 < argc;
  this_00 = (FILE *)this;
  if (1 < argc) {
    local_b8 = &this->fb_dump_size;
    iVar10 = 1;
    local_d0 = ppcVar9;
    local_c8 = this;
    do {
      __s1 = (FILE *)argv[iVar10];
      this_00 = __s1;
      iVar3 = strcmp((char *)__s1,"-help");
      if (iVar3 == 0) {
switchD_0010d315_caseD_68:
        this->help_flag = true;
      }
      else if ((char)__s1->_flags == '-') {
        cVar1 = *(char *)((long)&__s1->_flags + 1);
        uVar8 = (uint)cVar1;
        this_00 = (FILE *)(ulong)uVar8;
        iVar3 = isalpha(uVar8);
        this = local_c8;
        ppcVar9 = local_d0;
        if ((9 < uVar8 - 0x30 && iVar3 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0')) {
          __format = "Unrecognized argument: %s\n";
LAB_0010d5ae:
          this_00 = _stderr;
          fprintf(_stderr,__format,__s1);
LAB_0010d5b8:
          if (bVar2) {
            return;
          }
          break;
        }
        switch(cVar1) {
        case 'V':
          local_c8->version_flag = true;
          break;
        case 'W':
          local_c8->no_write_flag = true;
          break;
        case 'X':
        case 'Y':
        case '[':
        case '\\':
        case ']':
        case '^':
        case '_':
        case '`':
        case 'a':
        case 'c':
        case 'i':
        case 'j':
        case 'k':
        case 'l':
        case 'n':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'u':
        case 'x':
        case 'y':
switchD_0010d315_caseD_58:
          __format = "Unrecognized option: %s\n";
          goto LAB_0010d5ae;
        case 'Z':
          local_c8->j2c_pedantic = false;
          break;
        case 'b':
          iVar10 = iVar10 + 1;
          if ((iVar10 < argc) && (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags != '-')) {
            lVar5 = strtol((char *)this_00,(char **)0x0,10);
            lVar4 = -lVar5;
            if (0 < lVar5) {
              lVar4 = lVar5;
            }
            this->fb_size = (ui32_t)lVar4;
            if (this->verbose_flag == true) {
              this_00 = _stderr;
              fprintf(_stderr,"Frame Buffer size: %u bytes.\n");
            }
            break;
          }
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010d5b8;
        case 'd':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          local_c8->duration_flag = true;
          lVar5 = strtol((char *)this_00,(char **)0x0,10);
          lVar4 = -lVar5;
          if (0 < lVar5) {
            lVar4 = lVar5;
          }
          this->duration = (ui32_t)lVar4;
          break;
        case 'e':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (*argv[iVar10] == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          local_c8->extension = argv[iVar10];
          break;
        case 'f':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          lVar5 = strtol((char *)this_00,(char **)0x0,10);
          lVar4 = -lVar5;
          if (0 < lVar5) {
            lVar4 = lVar5;
          }
          this->start_frame = (ui32_t)lVar4;
          break;
        case 'g':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          lVar4 = strtol((char *)this_00,(char **)0x0,10);
          this->g_stream_sid = (i32_t)lVar4;
          break;
        case 'h':
          goto switchD_0010d315_caseD_68;
        case 'm':
          local_c8->read_hmac = true;
          break;
        case 'p':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          lVar5 = strtol((char *)this_00,(char **)0x0,10);
          lVar4 = -lVar5;
          if (0 < lVar5) {
            lVar4 = lVar5;
          }
          this->picture_rate = (ui32_t)lVar4;
          break;
        case 's':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          lVar5 = strtol((char *)this_00,(char **)0x0,10);
          lVar4 = -lVar5;
          if (0 < lVar5) {
            lVar4 = lVar5;
          }
          *local_b8 = (ui32_t)lVar4;
          break;
        case 'v':
          local_c8->verbose_flag = true;
          break;
        case 'w':
          iVar10 = iVar10 + 1;
          if ((argc <= iVar10) || (this_00 = (FILE *)argv[iVar10], (char)this_00->_flags == '-')) {
            CommandOptions((CommandOptions *)this_00);
            goto LAB_0010d5b8;
          }
          lVar5 = strtol((char *)this_00,(char **)0x0,10);
          lVar4 = -lVar5;
          if (0 < lVar5) {
            lVar4 = lVar5;
          }
          this->number_width = (ui32_t)lVar4;
          break;
        case 'z':
          local_c8->j2c_pedantic = true;
          break;
        default:
          if (cVar1 == '2') {
            local_c8->split_wav = true;
          }
          else {
            if (cVar1 != '1') goto switchD_0010d315_caseD_58;
            local_c8->mono_wav = true;
          }
        }
      }
      else if (*ppcVar9 == (char *)0x0) {
        *ppcVar9 = (char *)__s1;
      }
      else if (this->file_prefix == (char *)0x0) {
        this->file_prefix = (char *)__s1;
      }
      iVar10 = iVar10 + 1;
      bVar2 = iVar10 < argc;
    } while (iVar10 < argc);
  }
  if ((this->help_flag == false) && (this->version_flag == false)) {
    if (*ppcVar9 == (char *)0x0) {
      CommandOptions((CommandOptions *)this_00);
    }
    else {
      if (this->file_prefix == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,*ppcVar9,&local_d1);
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
        Kumu::PathSetExtension((string *)local_70,(string *)local_90);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_40 = *plVar7;
          lStack_38 = plVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar7;
          local_50 = (long *)*plVar6;
        }
        local_48 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&this->prefix_buffer,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        this->file_prefix = (this->prefix_buffer)._M_dataplus._M_p;
      }
      this->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    input_filename(0), extension(0), g_stream_sid(0)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		g_stream_sid = strtol(argv[i], 0, 10);
		break;
		  
	      case 'h': help_flag = true; break;
	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( input_filename == 0 )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    if ( file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }